

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_teebuf.hpp
# Opt level: O2

void __thiscall
OpenMD::basic_teebuf<char,_std::char_traits<char>_>::sync
          (basic_teebuf<char,_std::char_traits<char>_> *this)

{
  int iVar1;
  pointer ppbVar2;
  
  iVar1 = (**(code **)(*(long *)this + 0x68))(this,0xffffffff);
  if (iVar1 != -1) {
    ppbVar2 = (this->buffers_).
              super__Vector_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (ppbVar2 ==
          (this->buffers_).
          super__Vector_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        return;
      }
      iVar1 = (**(code **)(*(long *)*ppbVar2 + 0x30))();
      ppbVar2 = ppbVar2 + 1;
    } while (iVar1 != -1);
  }
  return;
}

Assistant:

int sync() {
      // flush buffer, checking return for eof.
      if (traits_type::eq_int_type(overflow(traits_type::eof()),
                                   traits_type::eof())) {
        return -1;
      }

      // flush streams
      typename std::vector<streambuf_type*>::iterator iter;
      for (iter = buffers_.begin(); iter != buffers_.end(); ++iter) {
        if ((*iter)->pubsync() == -1) { return -1; }
      }

      return 0;
    }